

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O0

void libtorrent::dht::anon_unknown_20::get_mutable_item_callback
               (item *it,bool authoritative,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  item *piVar1;
  bool bVar2;
  element_type *peVar3;
  sequence_number rhs;
  bool local_4a;
  bool local_49;
  sequence_number local_30;
  function<void_(const_libtorrent::dht::item_&,_bool)> *local_28;
  function<void_(const_libtorrent::dht::item_&,_bool)> *f_local;
  shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx> *ctx_local;
  item *piStack_10;
  bool authoritative_local;
  item *it_local;
  
  local_28 = f;
  f_local = (function<void_(const_libtorrent::dht::item_&,_bool)> *)ctx;
  ctx_local._7_1_ = authoritative;
  piStack_10 = it;
  if (authoritative) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ctx);
    peVar3->active_traversals = peVar3->active_traversals + -1;
  }
  local_49 = false;
  if ((ctx_local._7_1_ & 1) != 0) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ctx);
    local_49 = peVar3->active_traversals == 0;
  }
  ctx_local._7_1_ = local_49;
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ctx);
  bVar2 = item::empty(&peVar3->it);
  if (bVar2) {
    bVar2 = item::empty(piStack_10);
    local_4a = true;
    if (!bVar2) goto LAB_007ef889;
  }
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)ctx);
  local_30 = item::seq(&peVar3->it);
  rhs = item::seq(piStack_10);
  local_4a = sequence_number::operator<(&local_30,rhs);
LAB_007ef889:
  piVar1 = piStack_10;
  if (local_4a == false) {
    if ((ctx_local._7_1_ & 1) != 0) {
      ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::operator()
                (f,piStack_10,(bool)(ctx_local._7_1_ & 1));
    }
  }
  else {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)ctx);
    item::operator=(&peVar3->it,piVar1);
    ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::operator()
              (f,piStack_10,(bool)(ctx_local._7_1_ & 1));
  }
  return;
}

Assistant:

void get_mutable_item_callback(item const& it, bool authoritative
		, std::shared_ptr<get_mutable_item_ctx> ctx
		, std::function<void(item const&, bool)> f)
	{
		TORRENT_ASSERT(it.is_mutable());
		if (authoritative) --ctx->active_traversals;
		authoritative = authoritative && ctx->active_traversals == 0;
		if ((ctx->it.empty() && !it.empty()) || (ctx->it.seq() < it.seq()))
		{
			ctx->it = it;
			f(it, authoritative);
		}
		else if (authoritative)
			f(it, authoritative);
	}